

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int SUNQRfact(int n,sunrealtype **h,sunrealtype *q,int job)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  double dVar5;
  int code;
  int n_minus_1;
  int q_ptr;
  int k;
  int j;
  int i;
  sunrealtype temp3;
  sunrealtype temp2;
  sunrealtype temp1;
  sunrealtype s;
  sunrealtype c;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  int local_60;
  int local_54;
  int local_50;
  double local_30;
  double local_28;
  
  if (in_ECX == 0) {
    local_60 = 0;
    for (local_54 = 0; local_54 < in_EDI; local_54 = local_54 + 1) {
      for (local_50 = 0; local_50 < local_54 + -1; local_50 = local_50 + 1) {
        dVar5 = *(double *)(*(long *)(in_RSI + (long)local_50 * 8) + (long)local_54 * 8);
        dVar1 = *(double *)(*(long *)(in_RSI + (long)(local_50 + 1) * 8) + (long)local_54 * 8);
        dVar2 = *(double *)(in_RDX + (long)(local_50 * 2) * 8);
        dVar3 = *(double *)(in_RDX + (long)(local_50 * 2 + 1) * 8);
        *(double *)(*(long *)(in_RSI + (long)local_50 * 8) + (long)local_54 * 8) =
             dVar2 * dVar5 + -(dVar3 * dVar1);
        *(double *)(*(long *)(in_RSI + (long)(local_50 + 1) * 8) + (long)local_54 * 8) =
             dVar3 * dVar5 + dVar2 * dVar1;
      }
      dVar5 = *(double *)(*(long *)(in_RSI + (long)local_54 * 8) + (long)local_54 * 8);
      dVar1 = *(double *)(*(long *)(in_RSI + (long)(local_54 + 1) * 8) + (long)local_54 * 8);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if (ABS(dVar1) < ABS(dVar5)) {
          local_30 = dVar1 / dVar5;
          if (0.0 < local_30 * local_30 + 1.0) {
            local_70 = sqrt(local_30 * local_30 + 1.0);
          }
          else {
            local_70 = 0.0;
          }
          local_28 = 1.0 / local_70;
          local_30 = -local_28 * local_30;
        }
        else {
          local_28 = dVar5 / dVar1;
          if (0.0 < local_28 * local_28 + 1.0) {
            local_68 = sqrt(local_28 * local_28 + 1.0);
          }
          else {
            local_68 = 0.0;
          }
          local_30 = -1.0 / local_68;
          local_28 = -local_30 * local_28;
        }
      }
      else {
        local_28 = 1.0;
        local_30 = 0.0;
      }
      *(double *)(in_RDX + (long)(local_54 * 2) * 8) = local_28;
      *(double *)(in_RDX + (long)(local_54 * 2 + 1) * 8) = local_30;
      dVar5 = local_28 * dVar5 + -(local_30 * dVar1);
      *(double *)(*(long *)(in_RSI + (long)local_54 * 8) + (long)local_54 * 8) = dVar5;
      if ((dVar5 == 0.0) && (!NAN(dVar5))) {
        local_60 = local_54 + 1;
      }
    }
  }
  else {
    iVar4 = in_EDI + -1;
    local_60 = 0;
    for (local_54 = 0; local_54 < iVar4; local_54 = local_54 + 1) {
      dVar5 = *(double *)(*(long *)(in_RSI + (long)local_54 * 8) + (long)iVar4 * 8);
      dVar1 = *(double *)(*(long *)(in_RSI + (long)(local_54 + 1) * 8) + (long)iVar4 * 8);
      dVar2 = *(double *)(in_RDX + (long)(local_54 * 2) * 8);
      dVar3 = *(double *)(in_RDX + (long)(local_54 * 2 + 1) * 8);
      *(double *)(*(long *)(in_RSI + (long)local_54 * 8) + (long)iVar4 * 8) =
           dVar2 * dVar5 + -(dVar3 * dVar1);
      *(double *)(*(long *)(in_RSI + (long)(local_54 + 1) * 8) + (long)iVar4 * 8) =
           dVar3 * dVar5 + dVar2 * dVar1;
    }
    dVar5 = *(double *)(*(long *)(in_RSI + (long)iVar4 * 8) + (long)iVar4 * 8);
    dVar1 = *(double *)(*(long *)(in_RSI + (long)in_EDI * 8) + (long)iVar4 * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if (ABS(dVar1) < ABS(dVar5)) {
        local_30 = dVar1 / dVar5;
        if (0.0 < local_30 * local_30 + 1.0) {
          local_80 = sqrt(local_30 * local_30 + 1.0);
        }
        else {
          local_80 = 0.0;
        }
        local_28 = 1.0 / local_80;
        local_30 = -local_28 * local_30;
      }
      else {
        local_28 = dVar5 / dVar1;
        if (0.0 < local_28 * local_28 + 1.0) {
          local_78 = sqrt(local_28 * local_28 + 1.0);
        }
        else {
          local_78 = 0.0;
        }
        local_30 = -1.0 / local_78;
        local_28 = -local_30 * local_28;
      }
    }
    else {
      local_28 = 1.0;
      local_30 = 0.0;
    }
    *(double *)(in_RDX + (long)(iVar4 * 2) * 8) = local_28;
    *(double *)(in_RDX + (long)(iVar4 * 2 + 1) * 8) = local_30;
    dVar5 = local_28 * dVar5 + -(local_30 * dVar1);
    *(double *)(*(long *)(in_RSI + (long)iVar4 * 8) + (long)iVar4 * 8) = dVar5;
    if ((dVar5 == 0.0) && (!NAN(dVar5))) {
      local_60 = in_EDI;
    }
  }
  return local_60;
}

Assistant:

int SUNQRfact(int n, sunrealtype** h, sunrealtype* q, int job)
{
  sunrealtype c, s, temp1, temp2, temp3;
  int i, j, k, q_ptr, n_minus_1, code = 0;

  switch (job)
  {
  case 0:

    /* Compute a new factorization of H */

    code = 0;
    for (k = 0; k < n; k++)
    {
      /* Multiply column k by the previous k-1 Givens rotations */

      for (j = 0; j < k - 1; j++)
      {
        i           = 2 * j;
        temp1       = h[j][k];
        temp2       = h[j + 1][k];
        c           = q[i];
        s           = q[i + 1];
        h[j][k]     = c * temp1 - s * temp2;
        h[j + 1][k] = s * temp1 + c * temp2;
      }

      /* Compute the Givens rotation components c and s */

      q_ptr = 2 * k;
      temp1 = h[k][k];
      temp2 = h[k + 1][k];
      if (temp2 == ZERO)
      {
        c = ONE;
        s = ZERO;
      }
      else if (SUNRabs(temp2) >= SUNRabs(temp1))
      {
        temp3 = temp1 / temp2;
        s     = -ONE / SUNRsqrt(ONE + SUNSQR(temp3));
        c     = -s * temp3;
      }
      else
      {
        temp3 = temp2 / temp1;
        c     = ONE / SUNRsqrt(ONE + SUNSQR(temp3));
        s     = -c * temp3;
      }
      q[q_ptr]     = c;
      q[q_ptr + 1] = s;
      if ((h[k][k] = c * temp1 - s * temp2) == ZERO) { code = k + 1; }
    }
    break;

  default:

    /* Update the factored H to which a new column has been added */

    n_minus_1 = n - 1;
    code      = 0;

    /* Multiply the new column by the previous n-1 Givens rotations */

    for (k = 0; k < n_minus_1; k++)
    {
      i                   = 2 * k;
      temp1               = h[k][n_minus_1];
      temp2               = h[k + 1][n_minus_1];
      c                   = q[i];
      s                   = q[i + 1];
      h[k][n_minus_1]     = c * temp1 - s * temp2;
      h[k + 1][n_minus_1] = s * temp1 + c * temp2;
    }

    /* Compute new Givens rotation and multiply it times the last two
       entries in the new column of H.  Note that the second entry of
       this product will be 0, so it is not necessary to compute it. */

    temp1 = h[n_minus_1][n_minus_1];
    temp2 = h[n][n_minus_1];
    if (temp2 == ZERO)
    {
      c = ONE;
      s = ZERO;
    }
    else if (SUNRabs(temp2) >= SUNRabs(temp1))
    {
      temp3 = temp1 / temp2;
      s     = -ONE / SUNRsqrt(ONE + SUNSQR(temp3));
      c     = -s * temp3;
    }
    else
    {
      temp3 = temp2 / temp1;
      c     = ONE / SUNRsqrt(ONE + SUNSQR(temp3));
      s     = -c * temp3;
    }
    q_ptr        = 2 * n_minus_1;
    q[q_ptr]     = c;
    q[q_ptr + 1] = s;
    if ((h[n_minus_1][n_minus_1] = c * temp1 - s * temp2) == ZERO) { code = n; }
  }

  return (code);
}